

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O0

void __thiscall
bsim::quad_value_bit_vector::quad_value_bit_vector(quad_value_bit_vector *this,int N_)

{
  size_type sVar1;
  reference pvVar2;
  undefined4 in_ESI;
  vector<bsim::quad_value,_std::allocator<bsim::quad_value>_> *in_RDI;
  uint i;
  uchar in_stack_ffffffffffffffbf;
  undefined4 in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffd8;
  uchar in_stack_ffffffffffffffdf;
  undefined4 in_stack_ffffffffffffffe0;
  uint uVar3;
  uint uVar4;
  undefined4 in_stack_ffffffffffffffe4;
  
  std::vector<bsim::quad_value,_std::allocator<bsim::quad_value>_>::vector
            ((vector<bsim::quad_value,_std::allocator<bsim::quad_value>_> *)0x19c784);
  *(undefined4 *)
   &in_RDI[1].super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl.
    super__Vector_impl_data._M_start = in_ESI;
  std::vector<bsim::quad_value,_std::allocator<bsim::quad_value>_>::resize
            ((vector<bsim::quad_value,_std::allocator<bsim::quad_value>_> *)
             CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
  uVar3 = 0;
  while( true ) {
    uVar4 = uVar3;
    sVar1 = std::vector<bsim::quad_value,_std::allocator<bsim::quad_value>_>::size(in_RDI);
    if ((uint)sVar1 <= uVar3) break;
    quad_value::quad_value
              ((quad_value *)CONCAT44(uVar3,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbf);
    pvVar2 = std::vector<bsim::quad_value,_std::allocator<bsim::quad_value>_>::operator[]
                       (in_RDI,(ulong)uVar4);
    pvVar2->value = in_stack_ffffffffffffffdf;
    uVar3 = uVar4 + 1;
  }
  return;
}

Assistant:

quad_value_bit_vector(const int N_) : N(N_) {
      //bits.resize(NUM_BYTES(N));
      bits.resize(N);
      for (uint i = 0; i < ((uint) bits.size()); i++) {
	bits[i] = quad_value(0);
      }
      
      // for (int i = 0; i < N; i++) {
      //   set(i, 0);
      // }
    }